

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStreamComponent_GetAvailableFrames
                  (PaAlsaStreamComponent *self,unsigned_long *numFrames,int *xrunOccurred)

{
  PaHostApiTypeId hostApiType;
  int iVar1;
  pthread_t __thread1;
  long errorCode;
  undefined4 *in_RDX;
  snd_pcm_sframes_t *in_RSI;
  long in_RDI;
  int __pa_unsure_error_id;
  snd_pcm_sframes_t framesAvail;
  PaError result;
  snd_pcm_sframes_t local_28;
  
  local_28 = (*alsa_snd_pcm_avail_update)(*(snd_pcm_t **)(in_RDI + 0x38));
  *in_RDX = 0;
  if (local_28 == -0x20) {
    *in_RDX = 1;
    local_28 = 0;
  }
  else {
    hostApiType = (PaHostApiTypeId)local_28;
    if ((int)hostApiType < 0) {
      __thread1 = pthread_self();
      iVar1 = pthread_equal(__thread1,paUnixMainThread);
      if (iVar1 != 0) {
        errorCode = (long)(int)hostApiType;
        (*alsa_snd_strerror)(hostApiType);
        PaUtil_SetLastHostErrorInfo(hostApiType,errorCode,(char *)0x11e5e2);
      }
      PaUtil_DebugPrint(
                       "Expression \'framesAvail\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3620\n"
                       );
      return -9999;
    }
  }
  *in_RSI = local_28;
  return 0;
}

Assistant:

static PaError PaAlsaStreamComponent_GetAvailableFrames( PaAlsaStreamComponent *self, unsigned long *numFrames, int *xrunOccurred )
{
    PaError result = paNoError;
    snd_pcm_sframes_t framesAvail = alsa_snd_pcm_avail_update( self->pcm );
    *xrunOccurred = 0;

    if( -EPIPE == framesAvail )
    {
        *xrunOccurred = 1;
        framesAvail = 0;
    }
    else
    {
        ENSURE_( framesAvail, paUnanticipatedHostError );
    }

    *numFrames = framesAvail;

error:
    return result;
}